

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::createInvertedSwizzle
          (TGlslangToSpvTraverser *this,Decoration precision,TIntermTyped *node,Id parentResult)

{
  int iVar1;
  TLayoutPacking explicitLayout;
  Id IVar2;
  undefined4 extraout_var;
  long *plVar3;
  TGlslangToSpvTraverser *this_00;
  undefined4 extraout_var_01;
  TIntermAggregate *type;
  undefined1 auVar4 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> swizzle;
  _func_int **local_48;
  TString *pTStack_40;
  long local_38;
  undefined4 extraout_var_00;
  
  local_48 = (_func_int **)0x0;
  pTStack_40 = (TString *)0x0;
  local_38 = 0;
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x14])(node);
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x198))
                             ((long *)CONCAT44(extraout_var,iVar1));
  auVar4 = (**(code **)(*plVar3 + 0x30))(plVar3);
  type = (TIntermAggregate *)&stack0xffffffffffffffb8;
  convertSwizzle(auVar4._0_8_,(TIntermAggregate *)&stack0xffffffffffffffb8,auVar4._8_8_);
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  this_00 = (TGlslangToSpvTraverser *)CONCAT44(extraout_var_00,iVar1);
  explicitLayout = getExplicitLayout(this_00,(TType *)type);
  iVar1 = (*(this_00->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this_00);
  IVar2 = convertGlslangToSpvType
                    (this,(TType *)this_00,explicitLayout,
                     (TQualifier *)CONCAT44(extraout_var_01,iVar1),false,false);
  IVar2 = spv::Builder::createRvalueSwizzle
                    (&this->builder,precision,IVar2,parentResult,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffb8
                    );
  if (local_48 != (_func_int **)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  return IVar2;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createInvertedSwizzle(spv::Decoration precision, const glslang::TIntermTyped& node,
    spv::Id parentResult)
{
    std::vector<unsigned> swizzle;
    convertSwizzle(*node.getAsBinaryNode()->getRight()->getAsAggregate(), swizzle);
    return builder.createRvalueSwizzle(precision, convertGlslangToSpvType(node.getType()), parentResult, swizzle);
}